

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_OpenDefaultStream
                  (PaStream **stream,int inputChannelCount,int outputChannelCount,
                  PaSampleFormat sampleFormat,double sampleRate,unsigned_long framesPerBuffer,
                  PaStreamCallback *streamCallback,void *userData)

{
  PaError PVar1;
  PaDeviceInfo *pPVar2;
  PaStreamParameters *local_98;
  PaStreamParameters *hostApiOutputParametersPtr;
  PaStreamParameters *hostApiInputParametersPtr;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  PaError result;
  PaStreamCallback *streamCallback_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaSampleFormat sampleFormat_local;
  int outputChannelCount_local;
  int inputChannelCount_local;
  PaStream **stream_local;
  
  if (inputChannelCount < 1) {
    hostApiOutputParametersPtr = (PaStreamParameters *)0x0;
  }
  else {
    hostApiOutputParameters.hostApiSpecificStreamInfo._0_4_ = Pa_GetDefaultInputDevice();
    if ((PaDeviceIndex)hostApiOutputParameters.hostApiSpecificStreamInfo == -1) {
      return -0x2701;
    }
    hostApiOutputParameters.hostApiSpecificStreamInfo._4_4_ = inputChannelCount;
    Pa_GetDeviceInfo((PaDeviceIndex)hostApiOutputParameters.hostApiSpecificStreamInfo);
    hostApiOutputParametersPtr =
         (PaStreamParameters *)&hostApiOutputParameters.hostApiSpecificStreamInfo;
  }
  if (outputChannelCount < 1) {
    local_98 = (PaStreamParameters *)0x0;
  }
  else {
    hostApiInputParametersPtr._0_4_ = Pa_GetDefaultOutputDevice();
    if ((PaDeviceIndex)hostApiInputParametersPtr == -1) {
      return -0x2701;
    }
    hostApiInputParametersPtr._4_4_ = outputChannelCount;
    hostApiOutputParameters._0_8_ = sampleFormat;
    pPVar2 = Pa_GetDeviceInfo((PaDeviceIndex)hostApiInputParametersPtr);
    hostApiOutputParameters.sampleFormat = (PaSampleFormat)pPVar2->defaultHighOutputLatency;
    hostApiOutputParameters.suggestedLatency = 0.0;
    local_98 = (PaStreamParameters *)&hostApiInputParametersPtr;
  }
  PVar1 = Pa_OpenStream(stream,hostApiOutputParametersPtr,local_98,sampleRate,framesPerBuffer,0,
                        streamCallback,userData);
  return PVar1;
}

Assistant:

PaError Pa_OpenDefaultStream( PaStream** stream,
                              int inputChannelCount,
                              int outputChannelCount,
                              PaSampleFormat sampleFormat,
                              double sampleRate,
                              unsigned long framesPerBuffer,
                              PaStreamCallback *streamCallback,
                              void *userData )
{
    PaError result;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;

    PA_LOGAPI_ENTER_PARAMS( "Pa_OpenDefaultStream" );
    PA_LOGAPI(("\tPaStream** stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tint inputChannelCount: %d\n", inputChannelCount ));
    PA_LOGAPI(("\tint outputChannelCount: %d\n", outputChannelCount ));
    PA_LOGAPI(("\tPaSampleFormat sampleFormat: %d\n", sampleFormat ));
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
    PA_LOGAPI(("\tunsigned long framesPerBuffer: %d\n", framesPerBuffer ));
    PA_LOGAPI(("\tPaStreamCallback *streamCallback: 0x%p\n", streamCallback ));
    PA_LOGAPI(("\tvoid *userData: 0x%p\n", userData ));


    if( inputChannelCount > 0 )
    {
        hostApiInputParameters.device = Pa_GetDefaultInputDevice();
		if( hostApiInputParameters.device == paNoDevice )
			return paDeviceUnavailable; 
	
        hostApiInputParameters.channelCount = inputChannelCount;
        hostApiInputParameters.sampleFormat = sampleFormat;
        /* defaultHighInputLatency is used below instead of
           defaultLowInputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiInputParameters.suggestedLatency = 
             Pa_GetDeviceInfo( hostApiInputParameters.device )->defaultHighInputLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputChannelCount > 0 )
    {
        hostApiOutputParameters.device = Pa_GetDefaultOutputDevice();
		if( hostApiOutputParameters.device == paNoDevice )
			return paDeviceUnavailable; 

        hostApiOutputParameters.channelCount = outputChannelCount;
        hostApiOutputParameters.sampleFormat = sampleFormat;
        /* defaultHighOutputLatency is used below instead of
           defaultLowOutputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiOutputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiOutputParameters.device )->defaultHighOutputLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }


    result = Pa_OpenStream(
                 stream, hostApiInputParametersPtr, hostApiOutputParametersPtr,
                 sampleRate, framesPerBuffer, paNoFlag, streamCallback, userData );

    PA_LOGAPI(("Pa_OpenDefaultStream returned:\n" ));
    PA_LOGAPI(("\t*(PaStream** stream): 0x%p", *stream ));
    PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    return result;
}